

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImVec2 ImGui::ScrollToRectEx(ImGuiWindow *window,ImRect *item_rect,ImGuiScrollFlags flags)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ImVec2 IVar6;
  uint uVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  ImRect local_30;
  
  fVar16 = (window->InnerRect).Min.x;
  fVar13 = (window->InnerRect).Min.y;
  fVar11 = (window->InnerRect).Max.x;
  fVar15 = 1.0;
  fVar1 = (window->InnerRect).Max.y;
  uVar8 = flags;
  if ((flags & 0x15U) == 0) {
    uVar8 = (uint)window->ScrollbarX | flags;
  }
  fVar19 = fVar16 + -1.0;
  fVar10 = fVar13 + -1.0;
  fVar17 = fVar11 + 1.0;
  fVar14 = fVar1 + 1.0;
  if ((uVar8 & 0x2a) == 0) {
    uVar7 = 2;
    if (window->Appearing != false) {
      uVar7 = 0x20;
    }
    uVar8 = uVar8 | uVar7;
  }
  fVar18 = (item_rect->Min).x;
  fVar9 = (item_rect->Min).y;
  fVar2 = (item_rect->Max).x;
  fVar3 = (item_rect->Max).y;
  fVar4 = (GImGui->Style).ItemSpacing.x;
  fVar5 = (GImGui->Style).ItemSpacing.y;
  fVar12 = fVar4 + fVar4 + (fVar2 - fVar18);
  if (((uVar8 & 1) == 0) || (fVar2 <= fVar17 && fVar19 <= fVar18)) {
    if (((uVar8 & 0x10) != 0) || ((uVar8 & 4) != 0 && (fVar2 > fVar17 || fVar19 > fVar18))) {
      fVar15 = 0.0;
      if (fVar12 <= fVar17 - fVar19) {
        fVar18 = (float)(int)(((fVar18 + fVar2) - (fVar11 - fVar16)) * 0.5);
      }
      goto LAB_00115215;
    }
  }
  else {
    if ((fVar18 < fVar19) || (fVar17 - fVar19 < fVar12)) {
      fVar18 = fVar18 - fVar4;
      fVar15 = 0.0;
    }
    else {
      if (fVar2 < fVar17) goto LAB_0011523a;
      fVar18 = fVar2 + fVar4;
    }
LAB_00115215:
    (window->ScrollTarget).x = (float)(int)((fVar18 - (window->Pos).x) + (window->Scroll).x);
    (window->ScrollTargetCenterRatio).x = fVar15;
    (window->ScrollTargetEdgeSnapDist).x = 0.0;
  }
LAB_0011523a:
  fVar16 = fVar5 + fVar5 + (fVar3 - fVar9);
  if ((uVar8 & 2) == 0 || fVar3 <= fVar14 && fVar10 <= fVar9) {
    if (((uVar8 & 0x20) == 0) && ((uVar8 & 8) == 0 || fVar3 <= fVar14 && fVar10 <= fVar9))
    goto LAB_001152cc;
    fVar11 = 0.0;
    if (fVar16 <= fVar14 - fVar10) {
      fVar9 = (float)(int)(((fVar9 + fVar3) - (fVar1 - fVar13)) * 0.5);
    }
  }
  else if ((fVar9 < fVar10) || (fVar14 - fVar10 < fVar16)) {
    fVar9 = fVar9 - fVar5;
    fVar11 = 0.0;
  }
  else {
    if (fVar3 < fVar14) goto LAB_001152cc;
    fVar9 = fVar3 + fVar5;
    fVar11 = 1.0;
  }
  SetScrollFromPosY(window,fVar9 - (window->Pos).y,fVar11);
LAB_001152cc:
  IVar6 = CalcNextScrollFromScrollTargetAndClamp(window);
  fVar16 = IVar6.x - (window->Scroll).x;
  fVar13 = IVar6.y - (window->Scroll).y;
  if (((uVar8 & 0x40) == 0) && ((window->Flags & 0x1000000) != 0)) {
    uVar8 = (flags & 0xffffffeaU) + 1;
    if ((flags & 0x14U) == 0) {
      uVar8 = flags;
    }
    uVar7 = uVar8 & 0xffffffc1 | 2;
    if ((uVar8 & 0x28) == 0) {
      uVar7 = uVar8;
    }
    local_30.Min.x = (item_rect->Min).x - fVar16;
    local_30.Min.y = (item_rect->Min).y - fVar13;
    local_30.Max.x = (item_rect->Max).x - fVar16;
    local_30.Max.y = (item_rect->Max).y - fVar13;
    IVar6 = ScrollToRectEx(window->ParentWindow,&local_30,uVar7);
    fVar16 = fVar16 + IVar6.x;
    fVar13 = fVar13 + IVar6.y;
  }
  IVar6.y = fVar13;
  IVar6.x = fVar16;
  return IVar6;
}

Assistant:

ImVec2 ImGui::ScrollToRectEx(ImGuiWindow* window, const ImRect& item_rect, ImGuiScrollFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImRect window_rect(window->InnerRect.Min - ImVec2(1, 1), window->InnerRect.Max + ImVec2(1, 1));
    //GetForegroundDrawList(window)->AddRect(window_rect.Min, window_rect.Max, IM_COL32_WHITE); // [DEBUG]

    // Check that only one behavior is selected per axis
    IM_ASSERT((flags & ImGuiScrollFlags_MaskX_) == 0 || ImIsPowerOfTwo(flags & ImGuiScrollFlags_MaskX_));
    IM_ASSERT((flags & ImGuiScrollFlags_MaskY_) == 0 || ImIsPowerOfTwo(flags & ImGuiScrollFlags_MaskY_));

    // Defaults
    ImGuiScrollFlags in_flags = flags;
    if ((flags & ImGuiScrollFlags_MaskX_) == 0 && window->ScrollbarX)
        flags |= ImGuiScrollFlags_KeepVisibleEdgeX;
    if ((flags & ImGuiScrollFlags_MaskY_) == 0)
        flags |= window->Appearing ? ImGuiScrollFlags_AlwaysCenterY : ImGuiScrollFlags_KeepVisibleEdgeY;

    const bool fully_visible_x = item_rect.Min.x >= window_rect.Min.x && item_rect.Max.x <= window_rect.Max.x;
    const bool fully_visible_y = item_rect.Min.y >= window_rect.Min.y && item_rect.Max.y <= window_rect.Max.y;
    const bool can_be_fully_visible_x = (item_rect.GetWidth() + g.Style.ItemSpacing.x * 2.0f) <= window_rect.GetWidth();
    const bool can_be_fully_visible_y = (item_rect.GetHeight() + g.Style.ItemSpacing.y * 2.0f) <= window_rect.GetHeight();

    if ((flags & ImGuiScrollFlags_KeepVisibleEdgeX) && !fully_visible_x)
    {
        if (item_rect.Min.x < window_rect.Min.x || !can_be_fully_visible_x)
            SetScrollFromPosX(window, item_rect.Min.x - g.Style.ItemSpacing.x - window->Pos.x, 0.0f);
        else if (item_rect.Max.x >= window_rect.Max.x)
            SetScrollFromPosX(window, item_rect.Max.x + g.Style.ItemSpacing.x - window->Pos.x, 1.0f);
    }
    else if (((flags & ImGuiScrollFlags_KeepVisibleCenterX) && !fully_visible_x) || (flags & ImGuiScrollFlags_AlwaysCenterX))
    {
        float target_x = can_be_fully_visible_x ? ImFloor((item_rect.Min.x + item_rect.Max.x - window->InnerRect.GetWidth()) * 0.5f) : item_rect.Min.x;
        SetScrollFromPosX(window, target_x - window->Pos.x, 0.0f);
    }

    if ((flags & ImGuiScrollFlags_KeepVisibleEdgeY) && !fully_visible_y)
    {
        if (item_rect.Min.y < window_rect.Min.y || !can_be_fully_visible_y)
            SetScrollFromPosY(window, item_rect.Min.y - g.Style.ItemSpacing.y - window->Pos.y, 0.0f);
        else if (item_rect.Max.y >= window_rect.Max.y)
            SetScrollFromPosY(window, item_rect.Max.y + g.Style.ItemSpacing.y - window->Pos.y, 1.0f);
    }
    else if (((flags & ImGuiScrollFlags_KeepVisibleCenterY) && !fully_visible_y) || (flags & ImGuiScrollFlags_AlwaysCenterY))
    {
        float target_y = can_be_fully_visible_y ? ImFloor((item_rect.Min.y + item_rect.Max.y - window->InnerRect.GetHeight()) * 0.5f) : item_rect.Min.y;
        SetScrollFromPosY(window, target_y - window->Pos.y, 0.0f);
    }

    ImVec2 next_scroll = CalcNextScrollFromScrollTargetAndClamp(window);
    ImVec2 delta_scroll = next_scroll - window->Scroll;

    // Also scroll parent window to keep us into view if necessary
    if (!(flags & ImGuiScrollFlags_NoScrollParent) && (window->Flags & ImGuiWindowFlags_ChildWindow))
    {
        // FIXME-SCROLL: May be an option?
        if ((in_flags & (ImGuiScrollFlags_AlwaysCenterX | ImGuiScrollFlags_KeepVisibleCenterX)) != 0)
            in_flags = (in_flags & ~ImGuiScrollFlags_MaskX_) | ImGuiScrollFlags_KeepVisibleEdgeX;
        if ((in_flags & (ImGuiScrollFlags_AlwaysCenterY | ImGuiScrollFlags_KeepVisibleCenterY)) != 0)
            in_flags = (in_flags & ~ImGuiScrollFlags_MaskY_) | ImGuiScrollFlags_KeepVisibleEdgeY;
        delta_scroll += ScrollToRectEx(window->ParentWindow, ImRect(item_rect.Min - delta_scroll, item_rect.Max - delta_scroll), in_flags);
    }

    return delta_scroll;
}